

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolResid(SUNLinearSolver S,int myid)

{
  N_Vector p_Var1;
  double dVar2;
  double dVar3;
  N_Vector resid;
  double stop_time;
  double start_time;
  int myid_local;
  SUNLinearSolver S_local;
  
  dVar2 = get_time();
  p_Var1 = SUNLinSolResid(S);
  dVar3 = get_time();
  if (p_Var1 == (N_Vector)0x0) {
    printf(">>> FAILED test -- SUNLinSolResid returned NULL N_Vector on Proc %d \n",
           (ulong)(uint)myid);
    S_local._4_4_ = 1;
  }
  else {
    if ((myid == 0) && (printf("    PASSED test -- SUNLinSolResid\n"), print_time != 0)) {
      printf("    SUNLinSolResid Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 0;
  }
  return S_local._4_4_;
}

Assistant:

int Test_SUNLinSolResid(SUNLinearSolver S, int myid)
{
  double start_time, stop_time;
  N_Vector resid;

  /* this test can fail if the function returns NULL */
  start_time = get_time();
  resid = SUNLinSolResid(S);
  stop_time = get_time();   

  /* this test can also fail if the return value is negative */
  if (resid == NULL){
    printf(">>> FAILED test -- SUNLinSolResid returned NULL N_Vector on Proc %d \n", 
           myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolResid\n");
    PRINT_TIME("    SUNLinSolResid Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}